

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  char *zRight;
  int iVar1;
  FKey *pFVar2;
  bool local_59;
  Column *pCol;
  int iKey;
  char *zKey;
  FKey *pFStack_38;
  int iChildKey;
  FKey *p;
  int i;
  int chngRowid_local;
  int *aChange_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  if ((pParse->db->flags & 0x40000U) != 0) {
    if (aChange == (int *)0x0) {
      pFVar2 = sqlite3FkReferences(pTab);
      local_59 = true;
      if (pFVar2 == (FKey *)0x0) {
        local_59 = pTab->pFKey != (FKey *)0x0;
      }
      return (uint)local_59;
    }
    for (pFStack_38 = pTab->pFKey; pFStack_38 != (FKey *)0x0; pFStack_38 = pFStack_38->pNextFrom) {
      for (p._0_4_ = 0; (int)p < pFStack_38->nCol; p._0_4_ = (int)p + 1) {
        iVar1 = pFStack_38->aCol[(int)p].iFrom;
        if (-1 < aChange[iVar1]) {
          return 1;
        }
        if ((iVar1 == pTab->iPKey) && (chngRowid != 0)) {
          return 1;
        }
      }
    }
    for (pFStack_38 = sqlite3FkReferences(pTab); pFStack_38 != (FKey *)0x0;
        pFStack_38 = pFStack_38->pNextTo) {
      for (p._0_4_ = 0; (int)p < pFStack_38->nCol; p._0_4_ = (int)p + 1) {
        zRight = pFStack_38->aCol[(int)p].zCol;
        for (pCol._4_4_ = 0; pCol._4_4_ < pTab->nCol; pCol._4_4_ = pCol._4_4_ + 1) {
          if (zRight == (char *)0x0) {
            if ((pTab->aCol[pCol._4_4_].colFlags & 1) != 0) goto LAB_001e06f2;
          }
          else {
            iVar1 = sqlite3_stricmp(pTab->aCol[pCol._4_4_].zName,zRight);
            if (iVar1 == 0) {
LAB_001e06f2:
              if (-1 < aChange[pCol._4_4_]) {
                return 1;
              }
              if ((pCol._4_4_ == pTab->iPKey) && (chngRowid != 0)) {
                return 1;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the 
      ** table in question is either the child or parent table for any 
      ** foreign key constraint.  */
      return (sqlite3FkReferences(pTab) || pTab->pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      int i;
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        for(i=0; i<p->nCol; i++){
          int iChildKey = p->aCol[i].iFrom;
          if( aChange[iChildKey]>=0 ) return 1;
          if( iChildKey==pTab->iPKey && chngRowid ) return 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        for(i=0; i<p->nCol; i++){
          char *zKey = p->aCol[i].zCol;
          int iKey;
          for(iKey=0; iKey<pTab->nCol; iKey++){
            Column *pCol = &pTab->aCol[iKey];
            if( (zKey ? !sqlite3StrICmp(pCol->zName, zKey)
                      : (pCol->colFlags & COLFLAG_PRIMKEY)!=0) ){
              if( aChange[iKey]>=0 ) return 1;
              if( iKey==pTab->iPKey && chngRowid ) return 1;
            }
          }
        }
      }
    }
  }
  return 0;
}